

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

int response_determination(CManager cm,stone_type stone,action_class stage,event_item *event)

{
  int iVar1;
  char *__s2;
  CManager_conflict cm_00;
  void *pvVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  long in_RCX;
  undefined4 in_EDX;
  int *in_RSI;
  bool bVar5;
  proto_action *proto2;
  response_cache_element *resp;
  response_spec *mrd_2;
  response_instance_conflict instance_1;
  response_spec *mrd_1;
  response_instance_conflict instance;
  proto_action *proto;
  int action_generated;
  response_spec *mrd;
  int map_entry;
  int j;
  FMcompat_formats older_format;
  int *format_map;
  FMFormat *formatList;
  int format_count;
  int i;
  FMFormat matching_format;
  FMFormat conversion_target_format;
  int return_value;
  int nearest_proto_action;
  size_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  action_class in_stack_ffffffffffffff34;
  proto_action *in_stack_ffffffffffffff38;
  CManager in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  FMFormat in_stack_ffffffffffffff50;
  stone_type in_stack_ffffffffffffff58;
  EVaction act_num;
  undefined8 in_stack_ffffffffffffff60;
  EVstone stone_id;
  response_spec *mrd_00;
  CManager in_stack_ffffffffffffff68;
  CManager_conflict in_stack_ffffffffffffff70;
  stone_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar6;
  int local_64;
  undefined8 local_60;
  void *local_58;
  void *local_50;
  int local_48;
  int local_44;
  FMFormat local_40;
  FMFormat local_38;
  int local_30;
  int local_2c;
  long local_28;
  undefined4 local_1c;
  int *local_18;
  
  local_2c = -1;
  local_30 = 0;
  local_38 = (FMFormat)0x0;
  local_40 = (FMFormat)0x0;
  local_48 = 0;
  local_60 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_50 = INT_CMmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_58 = INT_CMmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  for (local_44 = 0; local_44 < local_18[0x12]; local_44 = local_44 + 1) {
    local_64 = 0;
    iVar1 = proto_action_in_stage(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    if (iVar1 != 0) {
      while( true ) {
        bVar5 = false;
        if (*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) != 0) {
          bVar5 = *(long *)(*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) +
                           (long)local_64 * 8) != 0;
        }
        if (!bVar5) break;
        in_stack_ffffffffffffff40 = (CManager)name_of_FMformat(*(undefined8 *)(local_28 + 0x30));
        __s2 = (char *)name_of_FMformat(*(undefined8 *)
                                         (*(long *)(*(long *)(local_18 + 0x14) +
                                                    (long)local_44 * 0x60 + 0x10) +
                                         (long)local_64 * 8));
        iVar1 = strcmp((char *)in_stack_ffffffffffffff40,__s2);
        if (iVar1 == 0) {
          local_50 = INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff28);
          local_58 = INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff28);
          *(undefined8 *)((long)local_50 + (long)local_48 * 8) =
               *(undefined8 *)
                (*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) +
                (long)local_64 * 8);
          *(int *)((long)local_58 + (long)local_48 * 4) = local_44;
          local_48 = local_48 + 1;
        }
        local_64 = local_64 + 1;
      }
      in_stack_ffffffffffffff4f = 0;
    }
  }
  *(undefined8 *)((long)local_50 + (long)local_48 * 8) = 0;
  if (*(long *)(local_28 + 0x30) == 0) {
    for (local_44 = 0; local_44 < local_18[0x12]; local_44 = local_44 + 1) {
      iVar1 = proto_action_in_stage(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      if ((iVar1 != 0) &&
         ((*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) == 0 ||
          (**(long **)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) == 0)))) {
        local_2c = local_44;
      }
    }
  }
  else {
    iVar1 = FMformat_compat_cmp2(*(undefined8 *)(local_28 + 0x30),local_50,local_48,&local_60);
    if (iVar1 != -1) {
      local_2c = *(int *)((long)local_58 + (long)iVar1 * 4);
      local_40 = *(FMFormat *)((long)local_50 + (long)iVar1 * 8);
    }
  }
  if (local_2c == -1) {
    for (local_44 = 0; local_44 < local_18[0x12]; local_44 = local_44 + 1) {
      iVar1 = proto_action_in_stage(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      if (iVar1 != 0) {
        if (((*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) == 0) ||
            (**(long **)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x10) == 0)) &&
           (*(int *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x48) != 1)) {
          local_2c = local_44;
        }
        if ((*(int *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60) == 6) &&
           (*(int *)(*(long *)(*(long *)(local_18 + 0x14) + (long)local_44 * 0x60 + 0x18) + 0x20) !=
            0)) {
          local_2c = local_44;
        }
      }
    }
  }
  free(local_50);
  free(local_58);
  if (local_2c != -1) {
    uVar6 = 0;
    cm_00 = (CManager_conflict)(*(long *)(local_18 + 0x14) + (long)local_2c * 0x60);
    if (*(response_types *)&cm_00->transports == 5) {
      in_stack_ffffffffffffff70 = *(CManager_conflict *)&cm_00->CManager_ID;
      switch((FMFormat)(ulong)*(uint *)&in_stack_ffffffffffffff70->transports) {
      case (FMFormat)0x0:
      case (FMFormat)0x2:
        if (*(int *)(local_28 + 4) == 0) {
          local_38 = *(FMFormat *)(local_28 + 0x30);
        }
        else {
          local_38 = localize_format(in_stack_ffffffffffffff40,
                                     (FMFormat)
                                     (ulong)*(uint *)&in_stack_ffffffffffffff70->transports);
        }
        break;
      case (FMFormat)0x1:
        local_38 = *(FMFormat *)&in_stack_ffffffffffffff70->in_format_count;
        break;
      case (FMFormat)0x3:
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                      ,0x523,
                      "int response_determination(CManager, stone_type, action_class, event_item *)"
                     );
      }
      in_stack_ffffffffffffff78 =
           (stone_type)
           generate_filter_code
                     ((CManager)CONCAT44(uVar6,in_stack_ffffffffffffff88),(response_spec *)cm_00,
                      in_stack_ffffffffffffff78,(FMFormat)in_stack_ffffffffffffff70);
      if (in_stack_ffffffffffffff78 == (stone_type)0x0) {
        return 0;
      }
      in_stack_ffffffffffffff78->default_action = *local_18;
      in_stack_ffffffffffffff78->is_frozen = local_2c;
      in_stack_ffffffffffffff34 = *(action_class *)&in_stack_ffffffffffffff70->transports;
      act_num = (EVaction)in_stack_ffffffffffffff60;
      stone_id = (EVstone)((ulong)in_stack_ffffffffffffff60 >> 0x20);
      if (in_stack_ffffffffffffff34 == Immediate) {
        INT_EVassoc_mutated_imm_action
                  (in_stack_ffffffffffffff68,stone_id,act_num,
                   (EVImmediateHandlerFunc)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   (FMFormat)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (int_free_func)cm_00);
      }
      else if (in_stack_ffffffffffffff34 == Immediate_and_Multi) {
        INT_EVassoc_mutated_imm_action
                  (in_stack_ffffffffffffff68,stone_id,act_num,
                   (EVImmediateHandlerFunc)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   (FMFormat)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (int_free_func)cm_00);
      }
      else {
        if (in_stack_ffffffffffffff34 != Bridge) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                        ,0x53d,
                        "int response_determination(CManager, stone_type, action_class, event_item *)"
                       );
        }
        INT_EVassoc_mutated_imm_action
                  (in_stack_ffffffffffffff68,stone_id,act_num,
                   (EVImmediateHandlerFunc)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   (FMFormat)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (int_free_func)cm_00);
      }
      local_30 = 1;
    }
    else if ((*(response_types *)&cm_00->transports == 6) ||
            (*(response_types *)&cm_00->transports == 0xb)) {
      mrd_00 = *(response_spec **)&cm_00->CManager_ID;
      in_stack_ffffffffffffff68 =
           (CManager)
           generate_multityped_code
                     (in_stack_ffffffffffffff68,mrd_00,in_stack_ffffffffffffff58,
                      (FMFormat *)in_stack_ffffffffffffff50);
      if (in_stack_ffffffffffffff68 == (CManager)0x0) {
        return 0;
      }
      *(int *)((long)&in_stack_ffffffffffffff68->transports + 4) = *local_18;
      in_stack_ffffffffffffff68->initialized = local_2c;
      INT_EVassoc_mutated_multi_action
                (in_stack_ffffffffffffff70,(EVstone)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (EVaction)in_stack_ffffffffffffff68,(EVMultiHandlerFunc)mrd_00,
                 in_stack_ffffffffffffff58,(FMFormat *)in_stack_ffffffffffffff50,
                 (int_free_func)cm_00);
      if (((mrd_00->u).multityped.accept_anonymous != 0) && (local_40 == (FMFormat)0x0)) {
        INT_EVassoc_anon_multi_action
                  (in_stack_ffffffffffffff70,(EVstone)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (EVaction)in_stack_ffffffffffffff68,(EVMultiHandlerFunc)mrd_00,
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      }
      if (*(int *)(local_28 + 4) != 0) {
        local_38 = local_40;
      }
      local_30 = 1;
    }
    else {
      local_38 = (FMFormat)0x0;
      if (cm_00->control_module_choice != (char *)0x0) {
        local_38 = *(FMFormat *)cm_00->control_module_choice;
      }
      if (local_18[10] == 0) {
        if (*(long *)(local_18 + 0xc) != 0) {
          free(*(void **)(local_18 + 0xc));
        }
        pvVar2 = INT_CMmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        *(void **)(local_18 + 0xc) = pvVar2;
      }
      else {
        pvVar2 = INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                               ,in_stack_ffffffffffffff28);
        *(void **)(local_18 + 0xc) = pvVar2;
      }
      iVar1 = local_18[10];
      local_18[10] = iVar1 + 1;
      puVar3 = (undefined8 *)(*(long *)(local_18 + 0xc) + (long)iVar1 * 0x30);
      puVar4 = (undefined4 *)(*(long *)(local_18 + 0x14) + (long)local_2c * 0x60);
      if (local_38 == (FMFormat)0x0) {
        *puVar3 = *(undefined8 *)(local_28 + 0x30);
      }
      else {
        *puVar3 = local_38;
      }
      *(int *)(puVar3 + 2) = local_2c;
      *(undefined4 *)((long)puVar3 + 0xc) = *puVar4;
      *(uint *)((long)puVar3 + 0x14) = (uint)(puVar4[0x12] == 1);
      *(undefined4 *)(puVar3 + 1) = local_1c;
    }
    if (local_38 != (FMFormat)0x0) {
      iVar1 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (*(int *)(local_28 + 4) == 0) {
        if (*(FMFormat *)(local_28 + 0x30) != local_38) {
          INT_EVassoc_conversion_action
                    (cm_00,iVar1,(int)in_stack_ffffffffffffff78,(FMFormat)in_stack_ffffffffffffff70,
                     (FMFormat)in_stack_ffffffffffffff68);
        }
      }
      else {
        INT_EVassoc_conversion_action
                  (cm_00,iVar1,(int)in_stack_ffffffffffffff78,(FMFormat)in_stack_ffffffffffffff70,
                   (FMFormat)in_stack_ffffffffffffff68);
      }
    }
    local_30 = 1;
  }
  fix_response_cache((stone_type)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  return local_30;
}

Assistant:

int
response_determination(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int nearest_proto_action = -1;
    int return_value = 0;
    FMFormat conversion_target_format = NULL;
    FMFormat matching_format = NULL;
    int i, format_count = 0;
    FMFormat * formatList;
    int *format_map;
    FMcompat_formats older_format = NULL;

    formatList =
	(FMFormat *) malloc((stone->proto_action_count + 1) * sizeof(FMFormat));
    format_map = (int *) malloc((stone->proto_action_count + 1) * sizeof(int));
    for (i = 0; i < stone->proto_action_count; i++) {
	int j = 0;
        if (!proto_action_in_stage(&stone->proto_actions[i], stage)) {
            continue;
        }
	while (stone->proto_actions[i].matching_reference_formats &&
	       (stone->proto_actions[i].matching_reference_formats[j] != NULL)) {
	    if (strcmp(name_of_FMformat(event->reference_format), name_of_FMformat(stone->proto_actions[i].matching_reference_formats[j])) == 0 ) {
		formatList = (FMFormat *) realloc(formatList, (format_count + 2) * sizeof(FMFormat));
		format_map = realloc(format_map, (format_count + 2) * sizeof(int));
		formatList[format_count] = stone->proto_actions[i].matching_reference_formats[j];
		format_map[format_count] = i;
		format_count++;
	    }
	    j++;
	}
    }
    formatList[format_count] = NULL;
    if (event->reference_format == NULL) {
	/* special case for unformatted input */
	for (i=0 ; i < stone->proto_action_count ; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage))
		continue;
	    if ((stone->proto_actions[i].matching_reference_formats == NULL) ||
		(stone->proto_actions[i].matching_reference_formats[0] == NULL))
		nearest_proto_action = i;
	}
    } else {
	int map_entry = FMformat_compat_cmp2(event->reference_format,
						    formatList,
						    format_count,
						    &older_format);
	if (map_entry != -1) {
            nearest_proto_action = format_map[map_entry];
            matching_format = formatList[map_entry];
        }
    }
    if (nearest_proto_action == -1) {
        /* special case for accepting anything */
        for (i=0; i < stone->proto_action_count; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage)) continue;
            if (((stone->proto_actions[i].matching_reference_formats == NULL) ||
		 (stone->proto_actions[i].matching_reference_formats[0] == NULL))
                && stone->proto_actions[i].data_state != Requires_Decoded) {
                nearest_proto_action = i;
            }
            if (stone->proto_actions[i].action_type == Action_Multi) {
		struct response_spec *mrd;

		mrd =
		    stone->proto_actions[i].o.imm.mutable_response_data;
		if (mrd->u.multityped.accept_anonymous) {
		    nearest_proto_action = i;
		}
            }
        }
    }
    free(formatList);
    free(format_map);
    if (nearest_proto_action != -1) {
	int action_generated = 0;
	proto_action *proto = &stone->proto_actions[nearest_proto_action];
	if (proto->action_type == Action_Immediate) {
	    /* must be immediate action */
	    response_instance instance;
	    struct response_spec *mrd;
	    mrd =
		proto->o.imm.mutable_response_data;
	    switch(mrd->response_type) {
	    case Response_Filter:
	    case Response_Router:
		if (event->event_encoded) {
		    conversion_target_format =
			localize_format(cm, event->reference_format);
		} else {
		    conversion_target_format = event->reference_format;
		}
		break;
	    case Response_Transform:
		conversion_target_format = mrd->u.transform.reference_input_format;
		break;
	    case Response_Multityped:
		assert(FALSE);
                break;
	    }

	    instance = generate_filter_code(cm, mrd, stone, conversion_target_format);
	    if (instance == NULL) return 0;
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    switch(mrd->response_type) {
	    case Response_Filter:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       filter_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Router:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       router_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Transform:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       transform_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
            default:
		assert(FALSE);
		break;
	    }
	    return_value = 1;
	} else 	if (proto->action_type == Action_Multi || proto->action_type == Action_Congestion) {
	    response_instance instance;
	    struct response_spec *mrd;

	    mrd =
		proto->o.imm.mutable_response_data;
	    instance = generate_multityped_code(cm, mrd, stone,
						 proto->matching_reference_formats);
	    if (instance == 0) {
                return 0;
            }
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    INT_EVassoc_mutated_multi_action(cm, stone->local_id, nearest_proto_action,
					     queued_wrapper, instance,
					     proto->matching_reference_formats, free_multi_response);
	    if (mrd->u.multityped.accept_anonymous && (matching_format == NULL)) {
		/* we're accepting this as an anonymous target */
		INT_EVassoc_anon_multi_action(cm, stone->local_id, nearest_proto_action, queued_wrapper, instance,
					      event->reference_format);
	    }
            if (event->event_encoded) {
                conversion_target_format = matching_format;
            }
            return_value = 1;
	} else {
	    response_cache_element *resp;

	    conversion_target_format = NULL;
	    if (proto->matching_reference_formats) {
		conversion_target_format = proto->matching_reference_formats[0];
	    }

	    /* we'll install the conversion later, first map the response */
	    if (stone->response_cache_count == 0) {
		if (stone->response_cache != NULL) free(stone->response_cache);
		stone->response_cache = malloc(sizeof(stone->response_cache[0]));
	    } else {
		stone->response_cache =
		    realloc(stone->response_cache,
			    (stone->response_cache_count + 1) * sizeof(stone->response_cache[0]));
	    }
	    resp = &stone->response_cache[stone->response_cache_count++];
	    proto_action *proto2 = &stone->proto_actions[nearest_proto_action];
	    if (conversion_target_format) {
		resp->reference_format = conversion_target_format;
	    } else {
		resp->reference_format = event->reference_format;
	    }
	    resp->proto_action_id = nearest_proto_action;
	    resp->action_type = proto2->action_type;
	    resp->requires_decoded = (proto2->data_state == Requires_Decoded);
            resp->stage = stage;
	}
	if (conversion_target_format != NULL) {
	    if (event->event_encoded) {
		/* create a decode action */
		INT_EVassoc_conversion_action(cm, stone->local_id, stage,
					      conversion_target_format,
					      event->reference_format);
		return_value = 1;
	    } else {
		if (event->reference_format != conversion_target_format) {
		    /* 
		     * create a decode action anyway, the event will be
		     * encoded to a buffer and then decoded into the target
		     * format.  Doing this more efficiently is difficult. 
		     */
		    INT_EVassoc_conversion_action(cm, stone->local_id, stage,
						  conversion_target_format,
						  event->reference_format);
		    return_value = 1;
		} else {
		    return_value = 1;
		}
	    }
	} else {
            return_value = 1;
        }
    }
    fix_response_cache(stone);
    return return_value;
}